

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

string * __thiscall
OpenMD::Stats::getDataType_abi_cxx11_(string *__return_storage_ptr__,Stats *this,int index)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &(this->data_).
              super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
              ._M_impl.super__Vector_impl_data._M_start[index].dataType);
  return __return_storage_ptr__;
}

Assistant:

std::string Stats::getDataType(int index) {
    assert(index >= 0 && index < ENDINDEX);
    return data_[index].dataType;
  }